

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

void __thiscall
pbrt::SummedAreaTable::SummedAreaTable(SummedAreaTable *this,Array2D<float> *values,Allocator alloc)

{
  float fVar1;
  double dVar2;
  int iVar3;
  float *pfVar4;
  double *pdVar5;
  Array2D<float> *in_RSI;
  Array2D<double> *in_RDI;
  double dVar6;
  int x_1;
  int y_1;
  int y;
  int x;
  double in_stack_fffffffffffffee8;
  Array2D<double> *in_stack_fffffffffffffef0;
  undefined8 in_stack_ffffffffffffff00;
  Array2D<double> *in_stack_ffffffffffffff08;
  allocator_type in_stack_ffffffffffffff10;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  
  Array2D<float>::XSize(in_RSI);
  Array2D<float>::YSize(in_RSI);
  Array2D<double>::Array2D
            (in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
             (int)in_stack_ffffffffffffff00,in_stack_ffffffffffffff10);
  pfVar4 = Array2D<float>::operator()
                     ((Array2D<float> *)in_stack_fffffffffffffef0,
                      (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                      SUB84(in_stack_fffffffffffffee8,0));
  fVar1 = *pfVar4;
  pdVar5 = Array2D<double>::operator()
                     (in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                      SUB84(in_stack_fffffffffffffee8,0));
  *pdVar5 = (double)fVar1;
  local_30 = 1;
  while( true ) {
    iVar3 = Array2D<double>::XSize(in_RDI);
    if (iVar3 <= local_30) break;
    pfVar4 = Array2D<float>::operator()
                       ((Array2D<float> *)in_stack_fffffffffffffef0,
                        (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                        SUB84(in_stack_fffffffffffffee8,0));
    fVar1 = *pfVar4;
    pdVar5 = Array2D<double>::operator()
                       (in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                        SUB84(in_stack_fffffffffffffee8,0));
    dVar2 = *pdVar5;
    pdVar5 = Array2D<double>::operator()
                       (in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                        SUB84(in_stack_fffffffffffffee8,0));
    *pdVar5 = (double)fVar1 + dVar2;
    local_30 = local_30 + 1;
  }
  local_34 = 1;
  while( true ) {
    iVar3 = Array2D<double>::YSize(in_RDI);
    if (iVar3 <= local_34) break;
    pfVar4 = Array2D<float>::operator()
                       ((Array2D<float> *)in_stack_fffffffffffffef0,
                        (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                        SUB84(in_stack_fffffffffffffee8,0));
    fVar1 = *pfVar4;
    pdVar5 = Array2D<double>::operator()
                       (in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                        SUB84(in_stack_fffffffffffffee8,0));
    dVar2 = *pdVar5;
    pdVar5 = Array2D<double>::operator()
                       (in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                        SUB84(in_stack_fffffffffffffee8,0));
    *pdVar5 = (double)fVar1 + dVar2;
    local_34 = local_34 + 1;
  }
  local_38 = 1;
  while( true ) {
    iVar3 = Array2D<double>::YSize(in_RDI);
    if (iVar3 <= local_38) break;
    local_3c = 1;
    while( true ) {
      iVar3 = Array2D<double>::XSize(in_RDI);
      if (iVar3 <= local_3c) break;
      pfVar4 = Array2D<float>::operator()
                         ((Array2D<float> *)in_stack_fffffffffffffef0,
                          (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                          SUB84(in_stack_fffffffffffffee8,0));
      dVar6 = (double)*pfVar4;
      pdVar5 = Array2D<double>::operator()
                         (in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                          SUB84(in_stack_fffffffffffffee8,0));
      dVar2 = *pdVar5;
      pdVar5 = Array2D<double>::operator()
                         (in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                          SUB84(in_stack_fffffffffffffee8,0));
      in_stack_fffffffffffffee8 = dVar6 + dVar2 + *pdVar5;
      in_stack_fffffffffffffef0 =
           (Array2D<double> *)
           Array2D<double>::operator()
                     (in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                      SUB84(in_stack_fffffffffffffee8,0));
      dVar2 = in_stack_fffffffffffffee8 -
              (double)(in_stack_fffffffffffffef0->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
      pdVar5 = Array2D<double>::operator()
                         (in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                          SUB84(in_stack_fffffffffffffee8,0));
      *pdVar5 = dVar2;
      local_3c = local_3c + 1;
    }
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

SummedAreaTable(const Array2D<Float> &values, Allocator alloc = {})
        : sum(values.XSize(), values.YSize(), alloc) {
        sum(0, 0) = values(0, 0);
        // Compute sums along first row and column
        for (int x = 1; x < sum.XSize(); ++x)
            sum(x, 0) = values(x, 0) + sum(x - 1, 0);
        for (int y = 1; y < sum.YSize(); ++y)
            sum(0, y) = values(0, y) + sum(0, y - 1);

        // Compute sums for the remainder of the entries
        for (int y = 1; y < sum.YSize(); ++y)
            for (int x = 1; x < sum.XSize(); ++x)
                sum(x, y) =
                    (values(x, y) + sum(x - 1, y) + sum(x, y - 1) - sum(x - 1, y - 1));
    }